

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O1

void __thiscall
QTableModel::updateRowIndexes
          (QTableModel *this,QModelIndexList *indexes,int movedFromRow,int movedToRow)

{
  int iVar1;
  QAbstractItemModel *pQVar2;
  iterator iVar3;
  iterator iVar4;
  int iVar5;
  long in_FS_OFFSET;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  quintptr qStack_48;
  QAbstractItemModel *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = QList<QModelIndex>::begin(indexes);
  iVar4 = QList<QModelIndex>::end(indexes);
  if (iVar3.i != iVar4.i) {
    do {
      iVar1 = (iVar3.i)->r;
      iVar5 = movedToRow;
      if (iVar1 != movedFromRow) {
        if (movedToRow < iVar1 || iVar1 <= movedFromRow) {
          iVar5 = (uint)(movedToRow <= iVar1 && iVar1 < movedFromRow) + iVar1;
        }
        else {
          iVar5 = iVar1 + -1;
        }
      }
      if (iVar5 != iVar1) {
        iVar1 = (iVar3.i)->c;
        pQVar2 = ((iVar3.i)->m).ptr;
        if (pQVar2 == (QAbstractItemModel *)0x0) {
          local_68 = 0xffffffffffffffff;
          local_60 = 0;
          uStack_58 = 0;
        }
        else {
          (**(code **)(*(long *)pQVar2 + 0x68))(&local_68,pQVar2,iVar3.i);
        }
        (**(code **)(*(long *)this + 0x60))(&local_50,this,iVar5,iVar1,&local_68);
        ((iVar3.i)->m).ptr = local_40;
        (iVar3.i)->r = (undefined4)local_50;
        (iVar3.i)->c = local_50._4_4_;
        (iVar3.i)->i = qStack_48;
      }
      iVar3.i = iVar3.i + 1;
      iVar4 = QList<QModelIndex>::end(indexes);
    } while (iVar3.i != iVar4.i);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTableModel::updateRowIndexes(QModelIndexList &indexes,
                                   int movedFromRow, int movedToRow)
{
    QModelIndexList::iterator it;
    for (it = indexes.begin(); it != indexes.end(); ++it) {
        int oldRow = (*it).row();
        int newRow = oldRow;
        if (oldRow == movedFromRow)
            newRow = movedToRow;
        else if (movedFromRow < oldRow && movedToRow >= oldRow)
            newRow = oldRow - 1;
        else if (movedFromRow > oldRow && movedToRow <= oldRow)
            newRow = oldRow + 1;
        if (newRow != oldRow)
            *it = index(newRow, (*it).column(), (*it).parent());
    }
}